

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::InternalLeaveCriticalSection(CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  PalCsInitState PVar1;
  uint uVar2;
  int iVar3;
  HANDLE pVVar4;
  int *piVar5;
  SIZE_T threadId;
  LONG lNewVal;
  LONG lVal;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  PCRITICAL_SECTION pCriticalSection_local;
  CPalThread *pThread_local;
  
  PVar1 = Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if (PVar1 == PalCsNotInitialized) {
    fprintf(_stderr,"] %s %s:%d","InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x35e);
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar4 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,"InternalLeaveCriticalSection");
  if (pVVar4 != pCriticalSection->OwningThread) {
    fprintf(_stderr,"] %s %s:%d","InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x361);
    fprintf(_stderr,"Expression: threadId == pPalCriticalSection->OwningThread\n");
  }
  uVar2 = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"] %s %s:%d","InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x365);
    fprintf(_stderr,
            "Expression: PALCS_LOCK_BIT & pPalCriticalSection->LockCount, Description: Trying to release an unlocked CS\n"
           );
  }
  if (pCriticalSection->RecursionCount < 1) {
    fprintf(_stderr,"] %s %s:%d","InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x367);
    fprintf(_stderr,
            "Expression: 0 < pPalCriticalSection->RecursionCount, Description: Trying to release an unlocked CS\n"
           );
  }
  iVar3 = pCriticalSection->RecursionCount + -1;
  pCriticalSection->RecursionCount = iVar3;
  if (0 < iVar3) {
    return;
  }
  pCriticalSection->OwningThread = (HANDLE)0x0;
  threadId._4_4_ = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
  do {
    if ((threadId._4_4_ & 1) == 0) {
      fprintf(_stderr,"] %s %s:%d","InternalLeaveCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x378);
      fprintf(_stderr,
              "Expression: 0 != (PALCS_LOCK_BIT & lVal), Description: Trying to release an unlocked CS\n"
             );
    }
    if ((threadId._4_4_ == 1) || ((threadId._4_4_ & 2) != 0)) {
      piVar5 = Volatile<int>::operator&((Volatile<int> *)&pCriticalSection->LockCount);
      threadId._0_4_ = InterlockedCompareExchange(piVar5,threadId._4_4_ & 0xfffffffe,threadId._4_4_)
      ;
      if ((uint)threadId == threadId._4_4_) {
        return;
      }
    }
    else {
      piVar5 = Volatile<int>::operator&((Volatile<int> *)&pCriticalSection->LockCount);
      threadId._0_4_ = InterlockedCompareExchange(piVar5,threadId._4_4_ - 3,threadId._4_4_);
      if ((uint)threadId == threadId._4_4_) {
        PALCS_WakeUpWaiter((PAL_CRITICAL_SECTION *)pCriticalSection);
        return;
      }
    }
    threadId._4_4_ = (uint)threadId;
  } while( true );
}

Assistant:

void InternalLeaveCriticalSection(CPalThread * pThread,
                                      PCRITICAL_SECTION pCriticalSection)
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);
        LONG lVal, lNewVal;

#ifdef _DEBUG
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);
        _ASSERTE(threadId == pPalCriticalSection->OwningThread);
#endif // _DEBUG

        _ASSERT_MSG(PALCS_LOCK_BIT & pPalCriticalSection->LockCount,
                    "Trying to release an unlocked CS\n");
        _ASSERT_MSG(0 < pPalCriticalSection->RecursionCount,
                    "Trying to release an unlocked CS\n");

        if (--pPalCriticalSection->RecursionCount > 0)
        {
            // Recursion was > 1, still owning the CS
            goto ILCS_cs_exit;
        }

        // Reset CS ownership
        pPalCriticalSection->OwningThread = NULL;

        // Load the current LockCount value
        lVal = pPalCriticalSection->LockCount;

        while (true)
        {
            _ASSERT_MSG(0 != (PALCS_LOCK_BIT & lVal),
                      "Trying to release an unlocked CS\n");

            // NB: In the fair lock case (PALCS_TRANSFER_OWNERSHIP_ON_RELEASE) the
            // PALCS_LOCK_AWAKENED_WAITER bit is not used
            if ( (PALCS_LOCK_BIT == lVal)
#ifndef PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                 || (PALCS_LOCK_AWAKENED_WAITER & lVal)
#endif // !PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                )
            {
                // Whether there are no waiters (PALCS_LOCK_BIT == lVal)
                // or a waiter has already been awakened, therefore we
                // just need to reset the lock bit and return
                lNewVal = lVal & ~PALCS_LOCK_BIT;
                CS_TRACE("[LCS-UN %p] Switching from {%d, %d, %d} to "
                    "{%d, %d, %d} ==>\n", pPalCriticalSection,
                    PALCS_GETWCOUNT(lVal), PALCS_GETAWBIT(lVal), PALCS_GETLBIT(lVal),
                    PALCS_GETWCOUNT(lNewVal), PALCS_GETAWBIT(lNewVal), PALCS_GETLBIT(lNewVal));

                lNewVal = InterlockedCompareExchange(&pPalCriticalSection->LockCount,
                                                     lNewVal, lVal);

                CS_TRACE("[LCS-UN %p] ==> %s\n", pPalCriticalSection,
                               (lNewVal == lVal) ? "OK" : "NO");

                if (lNewVal == lVal)
                {
                    goto ILCS_cs_exit;
                }
            }
            else
            {
                // There is at least one waiter, we need to wake it up

#ifdef PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                // Fair lock case: passing ownership on to the first waiter.
                // Here we need only to decrement the waiters count. CS will
                // remain locked and ownership will be passed to the waiter,
                // which will take care of setting ownership data as soon as
                // it wakes up
                lNewVal = lVal - PALCS_LOCK_WAITER_INC;
#else // PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                // Unfair lock case: we need to atomically decrement the waiters
                // count (we are about ot wake up one of them), set the
                // "waiter awakened" bit and to reset the "CS locked" bit.
                // Note that, since we know that at this time PALCS_LOCK_BIT
                // is set and PALCS_LOCK_AWAKENED_WAITER is not set, none of
                // the addenda will affect bits other than its target bit(s),
                // i.e. PALCS_LOCK_BIT will not affect PALCS_LOCK_AWAKENED_WAITER,
                // PALCS_LOCK_AWAKENED_WAITER will not affect the actual
                // count of waiters, and the latter will not change the two
                // former ones
                lNewVal = lVal - PALCS_LOCK_WAITER_INC +
                    PALCS_LOCK_AWAKENED_WAITER - PALCS_LOCK_BIT;
#endif // PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                CS_TRACE("[LCS-CN %p] Switching from {%d, %d, %d} to {%d, %d, %d} ==>\n",
                    pPalCriticalSection,
                    PALCS_GETWCOUNT(lVal), PALCS_GETAWBIT(lVal), PALCS_GETLBIT(lVal),
                    PALCS_GETWCOUNT(lNewVal), PALCS_GETAWBIT(lNewVal), PALCS_GETLBIT(lNewVal));

                lNewVal = InterlockedCompareExchange(&pPalCriticalSection->LockCount,
                                                     lNewVal, lVal);

                CS_TRACE("[LCS-CN %p] ==> %s\n", pPalCriticalSection,
                            (lNewVal == lVal) ? "OK" : "NO");

                if (lNewVal == lVal)
                {
                    // Wake up the waiter
                    PALCS_WakeUpWaiter (pPalCriticalSection);

#ifdef PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                    // In the fair lock case, we need to yield here to defeat
                    // the inherently unfair nature of the condition/predicate
                    // construct
                    sched_yield();
#endif // PALCS_TRANSFER_OWNERSHIP_ON_RELEASE

                    goto ILCS_cs_exit;
                }
            }

            // CS unlock failed due to race with another thread trying to
            // register as waiter on it. We need to keep on looping. We
            // intentionally do not yield here in order to reserve higher
            // priority for the releasing thread.
            //
            // At this point lNewVal contains the latest LockCount value
            // retrieved by one of the two InterlockedCompareExchange above;
            // we can use this value as expected LockCount for the next loop,
            // without the need to fetch it again.
            lVal = lNewVal;
        }

    ILCS_cs_exit:
        return;
    }